

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int xmlHashUpdateInternal
              (xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,void *payload,
              xmlHashDeallocator dealloc,int update)

{
  xmlHashEntry *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  undefined4 uVar5;
  uint hashValue;
  int iVar6;
  uint uVar7;
  xmlHashEntry *__src;
  xmlChar *__dest;
  xmlChar *pxVar8;
  xmlChar *__dest_00;
  uint uVar9;
  xmlHashEntry *pxVar10;
  xmlHashEntry *pxVar11;
  uint uVar12;
  uint uVar13;
  int found;
  size_t lengths [3];
  
  lengths[2] = 0;
  found = 0;
  lengths[0] = 0;
  lengths[1] = 0;
  if (key == (xmlChar *)0x0 || hash == (xmlHashTablePtr)0x0) {
    return -1;
  }
  hashValue = xmlHashValue(hash->randomSeed,key,key2,key3,lengths);
  uVar7 = hash->size;
  if (uVar7 == 0) {
    __src = (xmlHashEntry *)0x0;
  }
  else {
    __src = xmlHashFindEntry(hash,key,key2,key3,hashValue,&found);
    if (found != 0) {
      if (update == 0) {
        return 0;
      }
      if (dealloc != (xmlHashDeallocator)0x0) {
        (*dealloc)(__src->payload,__src->key);
      }
      __src->payload = payload;
      return 0;
    }
  }
  if ((uVar7 >> 3) * 7 < hash->nbElems + 1) {
    if (uVar7 == 0) {
      uVar7 = 8;
LAB_00130f4d:
      iVar6 = xmlHashGrow(hash,uVar7);
      if (iVar6 == 0) {
        uVar7 = hash->size - 1;
        uVar9 = uVar7 & hashValue;
        pxVar10 = hash->table;
        __src = pxVar10 + uVar9;
        if (pxVar10[uVar9].hashValue != 0) {
          uVar12 = 0;
          do {
            uVar13 = uVar9 + 1 + uVar12;
            __src = __src + 1;
            if ((uVar13 & uVar7) == 0) {
              __src = pxVar10;
            }
          } while ((__src->hashValue != 0) &&
                  (uVar12 = uVar12 + 1, uVar12 <= (uVar13 - __src->hashValue & uVar7)));
        }
        goto LAB_00130fa1;
      }
    }
    else if (-1 < (int)uVar7) {
      uVar7 = uVar7 * 2;
      goto LAB_00130f4d;
    }
LAB_001311bf:
    iVar6 = -1;
  }
  else {
LAB_00130fa1:
    if (hash->dict == (xmlDictPtr)0x0) {
      __dest = (xmlChar *)(*xmlMalloc)(lengths[0] + 1);
      if (__dest == (xmlChar *)0x0) goto LAB_001311bf;
      memcpy(__dest,key,lengths[0] + 1);
      if (key2 == (xmlChar *)0x0) {
        pxVar8 = (xmlChar *)0x0;
      }
      else {
        pxVar8 = (xmlChar *)(*xmlMalloc)(lengths[1] + 1);
        if (pxVar8 == (xmlChar *)0x0) {
          (*xmlFree)(__dest);
          goto LAB_001311bf;
        }
        memcpy(pxVar8,key2,lengths[1] + 1);
      }
      if (key3 == (xmlChar *)0x0) {
        __dest_00 = (xmlChar *)0x0;
      }
      else {
        __dest_00 = (xmlChar *)(*xmlMalloc)(lengths[2] + 1);
        if (__dest_00 == (xmlChar *)0x0) {
          (*xmlFree)(__dest);
          (*xmlFree)(pxVar8);
          goto LAB_001311bf;
        }
        memcpy(__dest_00,key3,lengths[2] + 1);
      }
    }
    else {
      iVar6 = xmlDictOwns(hash->dict,key);
      __dest = key;
      if ((iVar6 == 0) && (__dest = xmlDictLookup(hash->dict,key,-1), __dest == (xmlChar *)0x0)) {
        return -1;
      }
      if (key2 == (xmlChar *)0x0) {
        key2 = (xmlChar *)0x0;
      }
      else {
        iVar6 = xmlDictOwns(hash->dict,key2);
        if ((iVar6 == 0) && (key2 = xmlDictLookup(hash->dict,key2,-1), key2 == (xmlChar *)0x0)) {
          return -1;
        }
      }
      pxVar8 = key2;
      if (key3 == (xmlChar *)0x0) {
        __dest_00 = (xmlChar *)0x0;
      }
      else {
        iVar6 = xmlDictOwns(hash->dict,key3);
        __dest_00 = key3;
        if ((iVar6 == 0) &&
           (__dest_00 = xmlDictLookup(hash->dict,key3,-1), __dest_00 == (xmlChar *)0x0)) {
          return -1;
        }
      }
    }
    if (__src->hashValue != 0) {
      pxVar1 = hash->table;
      pxVar11 = pxVar1 + hash->size;
      pxVar10 = __src;
      do {
        pxVar10 = pxVar10 + 1;
        if (pxVar11 <= pxVar10) {
          pxVar10 = pxVar1;
        }
      } while (pxVar10->hashValue != 0);
      if (pxVar10 < __src) {
        memmove(pxVar1 + 1,pxVar1,(long)pxVar10 - (long)pxVar1);
        pxVar10 = pxVar11 + -1;
        pxVar1 = hash->table;
        uVar5 = *(undefined4 *)&pxVar11[-1].field_0x4;
        pxVar2 = pxVar11[-1].key;
        pxVar3 = pxVar11[-1].key2;
        pxVar4 = pxVar11[-1].key3;
        pxVar1->hashValue = pxVar11[-1].hashValue;
        *(undefined4 *)&pxVar1->field_0x4 = uVar5;
        pxVar1->key = pxVar2;
        pxVar1->key2 = pxVar3;
        pxVar1->key3 = pxVar4;
        pxVar1->payload = pxVar11[-1].payload;
      }
      memmove(__src + 1,__src,(long)pxVar10 - (long)__src);
    }
    __src->key = __dest;
    __src->key2 = pxVar8;
    __src->key3 = __dest_00;
    __src->payload = payload;
    __src->hashValue = hashValue | 0x80000000;
    hash->nbElems = hash->nbElems + 1;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static int
xmlHashUpdateInternal(xmlHashTablePtr hash, const xmlChar *key,
                      const xmlChar *key2, const xmlChar *key3,
                      void *payload, xmlHashDeallocator dealloc, int update) {
    xmlChar *copy, *copy2, *copy3;
    xmlHashEntry *entry = NULL;
    size_t lengths[3] = {0, 0, 0};
    unsigned hashValue;
    int found = 0;

    if ((hash == NULL) || (key == NULL))
        return(-1);

    /*
     * Check for an existing entry
     */
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, lengths);
    if (hash->size > 0)
        entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found) {
        if (update) {
            if (dealloc)
                dealloc(entry->payload, entry->key);
            entry->payload = payload;
        }

        return(0);
    }

    /*
     * Grow the hash table if needed
     */
    if (hash->nbElems + 1 > hash->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (hash->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            /* This guarantees that nbElems < INT_MAX */
            if (hash->size >= MAX_HASH_SIZE)
                return(-1);
            newSize = hash->size * 2;
        }
        if (xmlHashGrow(hash, newSize) != 0)
            return(-1);

        /*
         * Find new entry
         */
        mask = hash->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &hash->table[pos];

        if (entry->hashValue != 0) {
            do {
                displ++;
                pos++;
                entry++;
                if ((pos & mask) == 0)
                    entry = hash->table;
            } while ((entry->hashValue != 0) &&
                     ((pos - entry->hashValue) & mask) >= displ);
        }
    }

    /*
     * Copy keys
     */
    if (hash->dict != NULL) {
        if (xmlDictOwns(hash->dict, key)) {
            copy = (xmlChar *) key;
        } else {
            copy = (xmlChar *) xmlDictLookup(hash->dict, key, -1);
            if (copy == NULL)
                return(-1);
        }

        if ((key2 == NULL) || (xmlDictOwns(hash->dict, key2))) {
            copy2 = (xmlChar *) key2;
        } else {
            copy2 = (xmlChar *) xmlDictLookup(hash->dict, key2, -1);
            if (copy2 == NULL)
                return(-1);
        }
        if ((key3 == NULL) || (xmlDictOwns(hash->dict, key3))) {
            copy3 = (xmlChar *) key3;
        } else {
            copy3 = (xmlChar *) xmlDictLookup(hash->dict, key3, -1);
            if (copy3 == NULL)
                return(-1);
        }
    } else {
        copy = xmlMalloc(lengths[0] + 1);
        if (copy == NULL)
            return(-1);
        memcpy(copy, key, lengths[0] + 1);

        if (key2 != NULL) {
            copy2 = xmlMalloc(lengths[1] + 1);
            if (copy2 == NULL) {
                xmlFree(copy);
                return(-1);
            }
            memcpy(copy2, key2, lengths[1] + 1);
        } else {
            copy2 = NULL;
        }

        if (key3 != NULL) {
            copy3 = xmlMalloc(lengths[2] + 1);
            if (copy3 == NULL) {
                xmlFree(copy);
                xmlFree(copy2);
                return(-1);
            }
            memcpy(copy3, key3, lengths[2] + 1);
        } else {
            copy3 = NULL;
        }
    }

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = hash->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&hash->table[1], hash->table,
                    (char *) cur - (char *) hash->table);
            cur = end - 1;
            hash->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->key = copy;
    entry->key2 = copy2;
    entry->key3 = copy3;
    entry->payload = payload;
    /* OR with MAX_HASH_SIZE to make sure that the value is non-zero */
    entry->hashValue = hashValue | MAX_HASH_SIZE;

    hash->nbElems++;

    return(1);
}